

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O3

QuaternionT<float> __thiscall
Gs::Slerp<Gs::QuaternionT<float>,float>
          (Gs *this,QuaternionT<float> *from,QuaternionT<float> *to,float *t)

{
  QuaternionT<float> QVar1;
  size_t i;
  long lVar2;
  QuaternionT<float> *result_1;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float result;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  uint uVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  QuaternionT<float> QVar13;
  undefined1 auVar9 [16];
  
  fVar6 = 0.0;
  lVar2 = 0;
  do {
    fVar6 = fVar6 + (&from->x)[lVar2] * (&to->x)[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  fVar3 = -fVar6;
  if (-fVar6 <= fVar6) {
    fVar3 = fVar6;
  }
  if (1.0 - fVar3 <= 1.1920929e-07) {
    uVar8 = CONCAT44(*t,1.0 - *t);
  }
  else {
    fVar3 = acosf(fVar3);
    fVar4 = sinf(fVar3);
    fVar5 = sinf((1.0 - *t) * fVar3);
    fVar3 = sinf(fVar3 * *t);
    auVar10._4_4_ = extraout_XMM0_Db;
    auVar10._0_4_ = fVar5;
    auVar10._8_4_ = extraout_XMM0_Db;
    auVar10._12_4_ = extraout_XMM0_Db_00;
    auVar9._8_8_ = auVar10._8_8_;
    auVar9._4_4_ = fVar3;
    auVar9._0_4_ = fVar5;
    auVar11._4_4_ = fVar4;
    auVar11._0_4_ = fVar4;
    auVar11._8_4_ = fVar4;
    auVar11._12_4_ = fVar4;
    auVar11 = divps(auVar9,auVar11);
    uVar8 = auVar11._0_8_;
  }
  fVar7 = (float)uVar8;
  uVar12 = (uint)((ulong)uVar8 >> 0x20);
  QVar13.z = (uVar12 ^ 0x80000000) & -(uint)(fVar6 < 0.0);
  fVar5 = (float)(~-(uint)(fVar6 < 0.0) & uVar12 | QVar13.z);
  fVar6 = from->y;
  fVar3 = from->z;
  fVar4 = from->w;
  QVar1 = *to;
  *(float *)this = fVar5 * QVar1.x + fVar7 * from->x;
  *(float *)(this + 4) = fVar5 * QVar1.y + fVar7 * fVar6;
  *(float *)(this + 8) = fVar5 * QVar1.z + fVar7 * fVar3;
  *(float *)(this + 0xc) = fVar5 * QVar1.w + fVar7 * fVar4;
  QVar13.x = (float)(int)QVar1._0_8_;
  QVar13.y = (float)(int)((ulong)QVar1._0_8_ >> 0x20);
  QVar13.w = 0.0;
  return QVar13;
}

Assistant:

TVector Slerp(const TVector& from, const TVector& to, const TScalar& t)
{
    TScalar omega, cosom, sinom;
    TScalar scale0, scale1;

    /* Calculate cosine */
    cosom = Dot<TVector, TScalar>(from, to);

    /* Adjust signs (if necessary) */
    if (cosom < TScalar(0))
    {
        cosom = -cosom;
        scale1 = TScalar(-1);
    }
    else
        scale1 = TScalar(1);

    /* Calculate coefficients */
    if ((TScalar(1) - cosom) > std::numeric_limits<TScalar>::epsilon())
    {
        /* Standard case (slerp) */
        omega = std::acos(cosom);
        sinom = std::sin(omega);
        scale0 = std::sin((TScalar(1) - t) * omega) / sinom;
        scale1 *= std::sin(t * omega) / sinom;
    }
    else
    {
        /* 'from' and 'to' quaternions are very close, so we can do a linear interpolation */
        scale0 = TScalar(1) - t;
        scale1 *= t;
    }

    /* Calculate final values */
    return Mix(from, to, scale0, scale1);
}